

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O3

float mf_predict<dense_parameters>(gdmf *d,example *ec,dense_parameters *weights)

{
  v_array<float> *this;
  char cVar1;
  char cVar2;
  byte bVar3;
  pointer pbVar4;
  char *pcVar5;
  byte *pbVar6;
  float *pfVar7;
  example *ec_00;
  vw *pvVar8;
  pointer pbVar9;
  byte *pbVar10;
  ulong uVar11;
  vw_exception *this_00;
  float *pfVar12;
  ulong uVar13;
  size_t sVar14;
  ulong *puVar15;
  example *__range1;
  bool bVar16;
  float fVar17;
  float res;
  float extraout_XMM0_Da;
  float linear_prediction;
  pred_offset x_dot_r;
  pred_offset x_dot_l;
  float local_208;
  float local_204;
  example *local_200;
  vw *local_1f8;
  pointer local_1f0;
  float local_1e8 [2];
  long local_1e0;
  string local_1d8;
  float local_1b8 [2];
  ulong local_1b0;
  ostream local_1a8;
  
  local_1f8 = d->all;
  pbVar9 = (local_1f8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (local_1f8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != pbVar4) {
    sVar14 = ec->num_features;
    do {
      pcVar5 = (pbVar9->_M_dataplus)._M_p;
      cVar1 = *pcVar5;
      cVar2 = pcVar5[1];
      sVar14 = sVar14 - ((long)(ec->super_example_predict).feature_space[cVar2].values._end -
                         (long)(ec->super_example_predict).feature_space[cVar2].values._begin >> 2)
                        * ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
                           (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2
                          );
      ec->num_features = sVar14;
      cVar1 = *(pbVar9->_M_dataplus)._M_p;
      sVar14 = (ulong)d->rank *
               ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
                (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2) + sVar14;
      ec->num_features = sVar14;
      cVar1 = (pbVar9->_M_dataplus)._M_p[1];
      sVar14 = (ulong)d->rank *
               ((long)(ec->super_example_predict).feature_space[cVar1].values._end -
                (long)(ec->super_example_predict).feature_space[cVar1].values._begin >> 2) + sVar14;
      ec->num_features = sVar14;
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar4);
  }
  local_208 = (ec->l).simple.initial;
  this = &d->scalars;
  v_array<float>::clear(this);
  local_204 = 0.0;
  pbVar10 = (ec->super_example_predict).indices._begin;
  pbVar6 = (ec->super_example_predict).indices._end;
  if (pbVar10 != pbVar6) {
    fVar17 = 0.0;
    do {
      bVar3 = *pbVar10;
      pfVar12 = (ec->super_example_predict).feature_space[bVar3].values._begin;
      pfVar7 = (ec->super_example_predict).feature_space[bVar3].values._end;
      if (pfVar12 != pfVar7) {
        puVar15 = (ec->super_example_predict).feature_space[bVar3].indicies._begin;
        do {
          fVar17 = fVar17 + weights->_begin[*puVar15 & weights->_weight_mask] * *pfVar12;
          pfVar12 = pfVar12 + 1;
          puVar15 = puVar15 + 1;
          local_204 = fVar17;
        } while (pfVar12 != pfVar7);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar6);
  }
  local_200 = ec;
  v_array<float>::push_back(this,&local_204);
  local_208 = local_208 + local_204;
  pbVar9 = (d->all->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1f0 = (d->all->pairs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != local_1f0) {
    do {
      pcVar5 = (pbVar9->_M_dataplus)._M_p;
      cVar1 = *pcVar5;
      if (((ec->super_example_predict).feature_space[cVar1].values._end !=
           (ec->super_example_predict).feature_space[cVar1].values._begin) &&
         (cVar1 = pcVar5[1],
         d->rank != 0 &&
         (ec->super_example_predict).feature_space[cVar1].values._end !=
         (ec->super_example_predict).feature_space[cVar1].values._begin)) {
        uVar11 = (ulong)d->rank;
        uVar13 = 1;
        do {
          local_1b8[0] = 0.0;
          cVar1 = *(pbVar9->_M_dataplus)._M_p;
          pfVar12 = (ec->super_example_predict).feature_space[cVar1].values._begin;
          pfVar7 = (ec->super_example_predict).feature_space[cVar1].values._end;
          fVar17 = 0.0;
          if (pfVar12 != pfVar7) {
            puVar15 = (ec->super_example_predict).feature_space[cVar1].indicies._begin;
            do {
              fVar17 = fVar17 + weights->_begin[uVar13 + (*puVar15 & weights->_weight_mask)] *
                                *pfVar12;
              pfVar12 = pfVar12 + 1;
              puVar15 = puVar15 + 1;
              local_1b8[0] = fVar17;
            } while (pfVar12 != pfVar7);
          }
          local_1e8[0] = 0.0;
          local_1e0 = uVar11 + uVar13;
          cVar1 = (pbVar9->_M_dataplus)._M_p[1];
          pfVar12 = (ec->super_example_predict).feature_space[cVar1].values._begin;
          pfVar7 = (ec->super_example_predict).feature_space[cVar1].values._end;
          if (pfVar12 != pfVar7) {
            puVar15 = (ec->super_example_predict).feature_space[cVar1].indicies._begin;
            local_1e8[0] = 0.0;
            do {
              local_1e8[0] = local_1e8[0] +
                             weights->_begin[local_1e0 + (*puVar15 & weights->_weight_mask)] *
                             *pfVar12;
              pfVar12 = pfVar12 + 1;
              puVar15 = puVar15 + 1;
            } while (pfVar12 != pfVar7);
          }
          local_208 = local_208 + local_1b8[0] * local_1e8[0];
          local_1b0 = uVar13;
          v_array<float>::push_back(this,local_1b8);
          v_array<float>::push_back(this,local_1e8);
          uVar11 = (ulong)d->rank;
          bVar16 = uVar13 < uVar11;
          uVar13 = uVar13 + 1;
        } while (bVar16);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_1f0);
  }
  pvVar8 = local_1f8;
  ec_00 = local_200;
  if ((local_1f8->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (local_1f8->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_200->partial_prediction = local_208;
    (*local_1f8->set_minmax)(local_1f8->sd,(local_200->l).simple.label);
    res = GD::finalize_prediction(pvVar8->sd,ec_00->partial_prediction);
    (ec_00->pred).scalar = res;
    fVar17 = (ec_00->l).simple.label;
    if ((fVar17 != 3.4028235e+38) || (NAN(fVar17))) {
      (*pvVar8->loss->_vptr_loss_function[1])(pvVar8->loss,pvVar8->sd);
      ec_00->loss = extraout_XMM0_Da * ec_00->weight;
      res = (ec_00->pred).scalar;
    }
    if (pvVar8->audit == true) {
      print_result(d->all->stdout_fileno,res,-1.0,ec_00->tag);
      mf_print_offset_features(d,ec_00,0);
      res = (ec_00->pred).scalar;
    }
    return res;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_1a8,"cannot use triples in matrix factorization",0x2a);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd_mf.cc"
             ,0x96,&local_1d8);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

float mf_predict(gdmf& d, example& ec, T& weights)
{
  vw& all = *d.all;
  label_data& ld = ec.l.simple;
  float prediction = ld.initial;

  for (string& i : d.all->pairs)
  {
    ec.num_features -= ec.feature_space[(int)i[0]].size() * ec.feature_space[(int)i[1]].size();
    ec.num_features += ec.feature_space[(int)i[0]].size() * d.rank;
    ec.num_features += ec.feature_space[(int)i[1]].size() * d.rank;
  }

  // clear stored predictions
  d.scalars.clear();

  float linear_prediction = 0.;
  // linear terms

  for (features& fs : ec) GD::foreach_feature<float, GD::vec_add, T>(weights, fs, linear_prediction);

  // store constant + linear prediction
  // note: constant is now automatically added
  d.scalars.push_back(linear_prediction);

  prediction += linear_prediction;
  // interaction terms
  for (string& i : d.all->pairs)
  {
    if (ec.feature_space[(int)i[0]].size() > 0 && ec.feature_space[(int)i[1]].size() > 0)
    {
      for (uint64_t k = 1; k <= d.rank; k++)
      {
        // x_l * l^k
        // l^k is from index+1 to index+d.rank
        // float x_dot_l = sd_offset_add(weights, ec.atomics[(int)(*i)[0]].begin(), ec.atomics[(int)(*i)[0]].end(), k);
        pred_offset x_dot_l = {0., k};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[0]], x_dot_l);
        // x_r * r^k
        // r^k is from index+d.rank+1 to index+2*d.rank
        // float x_dot_r = sd_offset_add(weights, ec.atomics[(int)(*i)[1]].begin(), ec.atomics[(int)(*i)[1]].end(),
        // k+d.rank);
        pred_offset x_dot_r = {0., k + d.rank};
        GD::foreach_feature<pred_offset, offset_add, T>(weights, ec.feature_space[(int)i[1]], x_dot_r);

        prediction += x_dot_l.p * x_dot_r.p;

        // store prediction from interaction terms
        d.scalars.push_back(x_dot_l.p);
        d.scalars.push_back(x_dot_r.p);
      }
    }
  }

  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");

  // d.scalars has linear, x_dot_l_1, x_dot_r_1, x_dot_l_2, x_dot_r_2, ...

  ec.partial_prediction = prediction;

  all.set_minmax(all.sd, ld.label);

  ec.pred.scalar = GD::finalize_prediction(all.sd, ec.partial_prediction);

  if (ld.label != FLT_MAX)
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;

  if (all.audit)
    mf_print_audit_features(d, ec, 0);

  return ec.pred.scalar;
}